

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void BlendPlaneRow_C(uint8_t *src0,uint8_t *src1,uint8_t *alpha,uint8_t *dst,int width)

{
  int x;
  int width_local;
  uint8_t *dst_local;
  uint8_t *alpha_local;
  uint8_t *src1_local;
  uint8_t *src0_local;
  
  dst_local = dst;
  alpha_local = alpha;
  src1_local = src1;
  src0_local = src0;
  for (x = 0; x < width + -1; x = x + 2) {
    *dst_local = (uint8_t)((uint)*alpha_local * (uint)*src0_local +
                           (0xff - (uint)*alpha_local) * (uint)*src1_local + 0xff >> 8);
    dst_local[1] = (uint8_t)((uint)alpha_local[1] * (uint)src0_local[1] +
                             (0xff - (uint)alpha_local[1]) * (uint)src1_local[1] + 0xff >> 8);
    src0_local = src0_local + 2;
    src1_local = src1_local + 2;
    alpha_local = alpha_local + 2;
    dst_local = dst_local + 2;
  }
  if ((width & 1U) != 0) {
    *dst_local = (uint8_t)((uint)*alpha_local * (uint)*src0_local +
                           (0xff - (uint)*alpha_local) * (uint)*src1_local + 0xff >> 8);
  }
  return;
}

Assistant:

void BlendPlaneRow_C(const uint8_t* src0,
                     const uint8_t* src1,
                     const uint8_t* alpha,
                     uint8_t* dst,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst[0] = UBLEND(src0[0], src1[0], alpha[0]);
    dst[1] = UBLEND(src0[1], src1[1], alpha[1]);
    src0 += 2;
    src1 += 2;
    alpha += 2;
    dst += 2;
  }
  if (width & 1) {
    dst[0] = UBLEND(src0[0], src1[0], alpha[0]);
  }
}